

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_with_arguments.cpp
# Opt level: O3

Am_Wrapper * __thiscall Object_Key_Store_Data::Make_Unique(Object_Key_Store_Data *this)

{
  uint uVar1;
  Object_Key_Store_Data *pOVar2;
  
  uVar1 = (this->super_Am_Wrapper).refs;
  if (uVar1 != 1) {
    (this->super_Am_Wrapper).refs = uVar1 - 1;
    pOVar2 = (Object_Key_Store_Data *)operator_new(0x20);
    (pOVar2->super_Am_Wrapper).refs = 1;
    (pOVar2->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
         (_func_int **)&PTR_ID_002e2a60;
    Am_Object::Am_Object(&pOVar2->object,&this->object);
    pOVar2->key = this->key;
    this = pOVar2;
  }
  return &this->super_Am_Wrapper;
}

Assistant:

static Am_Value
from_object_procedure(Am_Object & /*self*/)
{
  Am_Value value;
  Object_Key_Store_Data *store =
      (Object_Key_Store_Data *)Am_Object_Advanced::Get_Context()->Get_Data();
  value = (store->object).Get(store->key);
  store->Release();
  return value;
}